

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::maybeElemexpr<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  undefined8 uVar1;
  bool bVar2;
  allocator<char> local_259;
  string local_258;
  Err local_238;
  Err local_218;
  Err *local_1f8;
  Err *err_1;
  MaybeResult<wasm::Ok> _val_1;
  MaybeResult<wasm::Ok> local_1a0;
  allocator<char> local_171;
  string local_170;
  Err local_150;
  uint local_12c;
  Err local_128;
  Err *local_108;
  Err *err;
  MaybeResult<wasm::Ok> _val;
  MaybeResult<wasm::Ok> inst;
  MaybeResult<wasm::Ok> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 local_40 [8];
  MaybeResult<wasm::Ok> result;
  ParseDeclsCtx *ctx_local;
  
  result.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ = ctx;
  MaybeResult<wasm::Ok>::MaybeResult((MaybeResult<wasm::Ok> *)local_40);
  uVar1 = result.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_;
  local_50 = sv("item",4);
  bVar2 = Lexer::takeSExprStart((Lexer *)uVar1,local_50);
  if (bVar2) {
    expr<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::Ok> *)
               ((long)&inst.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
               (ParseDeclsCtx *)
               result.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_);
    MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>
              (&local_88,
               (Result<wasm::Ok> *)
               ((long)&inst.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    MaybeResult<wasm::Ok>::operator=((MaybeResult<wasm::Ok> *)local_40,&local_88);
    MaybeResult<wasm::Ok>::~MaybeResult(&local_88);
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&inst.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  }
  else {
    bVar2 = Lexer::takeLParen((Lexer *)result.val.
                                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                       ._32_8_);
    if (!bVar2) {
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
      local_12c = 1;
      goto LAB_023ea6c7;
    }
    instr<wasm::WATParser::ParseDeclsCtx>
              ((MaybeResult<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
               (ParseDeclsCtx *)
               result.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_);
    bVar2 = wasm::MaybeResult::operator_cast_to_bool
                      ((MaybeResult *)
                       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    uVar1 = result.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_;
    if (bVar2) {
      MaybeResult<wasm::Ok>::MaybeResult
                ((MaybeResult<wasm::Ok> *)&err,
                 (MaybeResult<wasm::Ok> *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      local_108 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err);
      bVar2 = local_108 != (Err *)0x0;
      if (bVar2) {
        wasm::Err::Err(&local_128,local_108);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_128);
        wasm::Err::~Err(&local_128);
      }
      local_12c = (uint)bVar2;
      MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err);
      if (local_12c == 0) {
        local_12c = 0;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"expected instruction",&local_171);
      Lexer::err(&local_150,(Lexer *)uVar1,&local_170);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_150);
      wasm::Err::~Err(&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
      local_12c = 1;
    }
    MaybeResult<wasm::Ok>::~MaybeResult
              ((MaybeResult<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    if (local_12c != 0) goto LAB_023ea6c7;
    NullInstrParserCtx::makeExpr
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
               (NullInstrParserCtx *)
               result.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_);
    MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>
              (&local_1a0,
               (Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    MaybeResult<wasm::Ok>::operator=((MaybeResult<wasm::Ok> *)local_40,&local_1a0);
    MaybeResult<wasm::Ok>::~MaybeResult(&local_1a0);
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  }
  MaybeResult<wasm::Ok>::MaybeResult
            ((MaybeResult<wasm::Ok> *)&err_1,(MaybeResult<wasm::Ok> *)local_40);
  local_1f8 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_1);
  bVar2 = local_1f8 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_218,local_1f8);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_218);
    wasm::Err::~Err(&local_218);
  }
  local_12c = (uint)bVar2;
  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_1);
  if (local_12c == 0) {
    bVar2 = Lexer::takeRParen((Lexer *)result.val.
                                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                       ._32_8_);
    uVar1 = result.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_;
    if (bVar2) {
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,(MaybeResult<wasm::Ok> *)local_40);
      local_12c = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"expected end of element expression",&local_259);
      Lexer::err(&local_238,(Lexer *)uVar1,&local_258);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_238);
      wasm::Err::~Err(&local_238);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator(&local_259);
      local_12c = 1;
    }
  }
LAB_023ea6c7:
  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::ExprT> maybeElemexpr(Ctx& ctx) {
  MaybeResult<typename Ctx::ExprT> result;
  if (ctx.in.takeSExprStart("item"sv)) {
    result = expr(ctx);
  } else if (ctx.in.takeLParen()) {
    // TODO: `instr` should included both folded and unfolded instrs.
    if (auto inst = instr(ctx)) {
      CHECK_ERR(inst);
    } else {
      return ctx.in.err("expected instruction");
    }
    result = ctx.makeExpr();
  } else {
    return {};
  }
  CHECK_ERR(result);
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of element expression");
  }
  return result;
}